

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox.cpp
# Opt level: O0

void __thiscall CMU462::BBox::draw(BBox *this,Color c)

{
  undefined8 *in_RDI;
  ulong in_XMM0_Qa;
  ulong in_XMM1_Qa;
  undefined4 uStack_c;
  undefined4 uStack_4;
  
  uStack_c = (undefined4)(in_XMM0_Qa >> 0x20);
  uStack_4 = (undefined4)(in_XMM1_Qa >> 0x20);
  glColor4f(in_XMM0_Qa & 0xffffffff,uStack_c,in_XMM1_Qa & 0xffffffff,uStack_4);
  glBegin(3);
  glVertex3d(*in_RDI,in_RDI[1],in_RDI[2]);
  glVertex3d(*in_RDI,in_RDI[1],in_RDI[5]);
  glVertex3d(in_RDI[3],in_RDI[1],in_RDI[5]);
  glVertex3d(in_RDI[3],in_RDI[1],in_RDI[2]);
  glVertex3d(*in_RDI,in_RDI[1],in_RDI[2]);
  glEnd();
  glBegin(3);
  glVertex3d(in_RDI[3],in_RDI[4],in_RDI[5]);
  glVertex3d(in_RDI[3],in_RDI[4],in_RDI[2]);
  glVertex3d(*in_RDI,in_RDI[4],in_RDI[2]);
  glVertex3d(*in_RDI,in_RDI[4],in_RDI[5]);
  glVertex3d(in_RDI[3],in_RDI[4],in_RDI[5]);
  glEnd();
  glBegin(1);
  glVertex3d(*in_RDI,in_RDI[1],in_RDI[2]);
  glVertex3d(*in_RDI,in_RDI[4],in_RDI[2]);
  glVertex3d(*in_RDI,in_RDI[1],in_RDI[5]);
  glVertex3d(*in_RDI,in_RDI[4],in_RDI[5]);
  glVertex3d(in_RDI[3],in_RDI[1],in_RDI[5]);
  glVertex3d(in_RDI[3],in_RDI[4],in_RDI[5]);
  glVertex3d(in_RDI[3],in_RDI[1],in_RDI[2]);
  glVertex3d(in_RDI[3],in_RDI[4],in_RDI[2]);
  glEnd();
  return;
}

Assistant:

void BBox::draw(Color c) const {
  glColor4f(c.r, c.g, c.b, c.a);

  // top
  glBegin(GL_LINE_STRIP);
  glVertex3d(max.x, max.y, max.z);
  glVertex3d(max.x, max.y, min.z);
  glVertex3d(min.x, max.y, min.z);
  glVertex3d(min.x, max.y, max.z);
  glVertex3d(max.x, max.y, max.z);
  glEnd();

  // bottom
  glBegin(GL_LINE_STRIP);
  glVertex3d(min.x, min.y, min.z);
  glVertex3d(min.x, min.y, max.z);
  glVertex3d(max.x, min.y, max.z);
  glVertex3d(max.x, min.y, min.z);
  glVertex3d(min.x, min.y, min.z);
  glEnd();

  // side
  glBegin(GL_LINES);
  glVertex3d(max.x, max.y, max.z);
  glVertex3d(max.x, min.y, max.z);
  glVertex3d(max.x, max.y, min.z);
  glVertex3d(max.x, min.y, min.z);
  glVertex3d(min.x, max.y, min.z);
  glVertex3d(min.x, min.y, min.z);
  glVertex3d(min.x, max.y, max.z);
  glVertex3d(min.x, min.y, max.z);
  glEnd();
}